

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined8 *puVar2;
  int n;
  ImU32 IVar3;
  char *pcVar4;
  ImGuiPayload *pIVar5;
  ImGuiPayload *pIVar6;
  long lVar7;
  int iVar8;
  char *p;
  byte *buf_00;
  uint flags_00;
  uint uVar9;
  char **ppcVar10;
  float *col_00;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar16;
  ulong uVar17;
  ImGuiContext *pIVar18;
  bool bVar19;
  uint uVar20;
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float local_158 [4];
  ImGuiWindow *local_148;
  ulong local_140;
  float local_138;
  float local_134;
  ulong local_130;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  uint local_118;
  int iStack_114;
  undefined8 uStack_110;
  char *local_100;
  char *local_f8;
  ImGuiWindow *local_f0;
  float *local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_cc;
  undefined1 local_c8 [16];
  ImGuiContext *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ulong local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  char buf [64];
  uint uVar15;
  
  pIVar18 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_e8 = col;
    local_128 = GetFrameHeight();
    local_124 = CalcItemWidth();
    local_c8 = ZEXT416(0);
    if ((flags & 0x10U) == 0) {
      local_c8 = ZEXT416((uint)((pIVar18->Style).ItemInnerSpacing.x + local_128));
    }
    pcVar4 = FindRenderedTextEnd(label,(char *)0x0);
    (pIVar18->NextItemData).Flags = 0;
    BeginGroup();
    PushID(label);
    uVar9 = flags & 0xff8ffff7U | 0x100008;
    if ((flags & 0x20U) == 0) {
      uVar9 = flags;
    }
    if ((uVar9 & 8) == 0) {
      ColorEditOptionsPopup(local_e8,uVar9);
    }
    col_00 = local_e8;
    if ((uVar9 & 0x700000) == 0) {
      uVar9 = uVar9 | pIVar18->ColorEditOptions & 0x700000U;
    }
    if ((uVar9 & 0x1800000) == 0) {
      uVar9 = uVar9 | pIVar18->ColorEditOptions & 0x1800000U;
    }
    local_f0 = pIVar1;
    local_f8 = pcVar4;
    local_d8 = flags;
    if ((uVar9 & 0x6000000) == 0) {
      uVar9 = uVar9 | pIVar18->ColorEditOptions & 0x6000000U;
    }
    local_148 = (ImGuiWindow *)CONCAT44(local_148._4_4_,uVar9);
    uVar11 = 0;
    if ((uVar9 & 0x18000000) == 0) {
      uVar11 = pIVar18->ColorEditOptions & 0x18000000;
    }
    uVar11 = uVar11 | uVar9;
    uVar9 = pIVar18->ColorEditOptions & 0xe00fffffU | uVar11;
    local_158._0_8_ = *(undefined8 *)local_e8;
    local_158[2] = local_e8[2];
    local_130 = CONCAT44(local_130._4_4_,uVar9);
    if ((uVar9 & 2) == 0) {
      local_158[3] = local_e8[3];
    }
    else {
      local_158[3] = 1.0;
    }
    local_d0 = uVar11 & 0x10100000;
    local_d4 = ~uVar11;
    if ((uVar11 & 0x10100000) == 0x10100000) {
      ColorConvertHSVtoRGB
                ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                 local_158 + 1,local_158 + 2);
    }
    else if ((~uVar11 & 0x8200000) == 0) {
      ColorConvertRGBtoHSV
                ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                 local_158 + 1,local_158 + 2);
      ColorEditRestoreHS(col_00,local_158,local_158 + 1,local_158 + 2);
    }
    uVar17 = local_130;
    uVar20 = (uint)(local_158[0] * 255.0 +
                   (float)(-(uint)(0.0 <= local_158[0]) & 0x3f000000 |
                          ~-(uint)(0.0 <= local_158[0]) & 0xbf000000));
    _local_118 = CONCAT44((int)(local_158[1] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[1]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[1]) & 0xbf000000)),uVar20);
    uStack_110 = CONCAT44((int)(local_158[3] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[3]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[3]) & 0xbf000000)),
                          (int)(local_158[2] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[2]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[2]) & 0xbf000000)));
    local_a8 = (local_f0->DC).CursorPos;
    IVar21 = local_a8;
    uStack_a0 = 0;
    fVar22 = (float)local_c8._0_4_;
    if ((pIVar18->Style).ColorButtonPosition != 0) {
      fVar22 = 0.0;
    }
    local_138 = local_124 - (float)local_c8._0_4_;
    uVar15 = (uint)((uVar9 & 2) == 0);
    uVar14 = uVar15 + 3;
    (local_f0->DC).CursorPos.x = fVar22 + local_a8.x;
    flags_00 = (uint)local_130;
    uVar9 = (uint)local_148;
    local_98 = (ulong)uVar14;
    local_a8 = IVar21;
    if ((((ulong)local_148 & 0x300000) == 0) || ((local_130 & 0x20) != 0)) {
      local_140 = 0;
      if (((uint)local_148 >> 0x16 & 1) == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        label = label;
        if ((local_130 & 0x20) == 0) {
          if (0xfe < (int)uVar20) {
            uVar20 = 0xff;
          }
          uVar16 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar16 = 0;
          }
          if ((local_130 & 2) == 0) {
            pcVar4 = "#%02X%02X%02X%02X";
          }
          else {
            pcVar4 = "#%02X%02X%02X";
          }
          local_100 = label;
          ImFormatString(buf,0x40,pcVar4,uVar16);
          SetNextItemWidth(local_138);
          uVar16 = 0;
          buf_00 = (byte *)buf;
          bVar19 = InputText("##Text",(char *)buf_00,0x40,6,(ImGuiInputTextCallback)0x0,(void *)0x0)
          ;
          if (bVar19) {
            while (((ulong)*buf_00 < 0x24 && ((0x900000200U >> ((ulong)*buf_00 & 0x3f) & 1) != 0)))
            {
              buf_00 = buf_00 + 1;
            }
            _local_118 = 0;
            uStack_110 = 0xff00000000;
            if ((uVar17 & 2) == 0) {
              __isoc99_sscanf(buf_00,"%02X%02X%02X%02X",&local_118,&iStack_114,&uStack_110,
                              (long)&uStack_110 + 4);
            }
            else {
              __isoc99_sscanf(buf_00,"%02X%02X%02X",&local_118,&iStack_114,&uStack_110,
                              (long)&uStack_110 + 4);
            }
            uVar16 = 1;
          }
          if ((uVar17 & 8) == 0) {
            OpenPopupOnItemClick("context",1);
          }
          local_140 = 0;
          label = local_100;
        }
      }
    }
    else {
      local_b0 = pIVar18;
      local_140 = CONCAT44(local_140._4_4_,(pIVar18->Style).ItemInnerSpacing.x);
      pcVar4 = "M:0.000";
      if (((uint)local_148 >> 0x18 & 1) == 0) {
        pcVar4 = "M:000";
      }
      uVar17 = 0;
      local_100 = label;
      local_dc = uVar11;
      IVar21 = CalcTextSize(pcVar4,(char *)0x0,false,-1.0);
      bVar19 = (flags_00 >> 0x13 & 1) != 0;
      fVar22 = (float)(uVar15 + 2);
      fVar23 = (float)(int)((local_138 - (float)local_140 * fVar22) / (float)uVar14);
      local_11c = 1.0;
      if (1.0 <= fVar23) {
        local_11c = fVar23;
      }
      fVar22 = (float)(int)(local_138 - ((float)local_140 + local_11c) * fVar22);
      local_120 = 1.0;
      if (bVar19) {
        local_120 = 0.0;
      }
      local_134 = 1.0;
      if (1.0 <= fVar22) {
        local_134 = fVar22;
      }
      local_cc = 0xff;
      if (bVar19) {
        local_cc = 0;
      }
      local_90 = (ulong)(uVar14 * 4);
      iVar8 = ((uVar9 >> 0x15 & 1) != 0) + 1;
      if (local_11c <= IVar21.x) {
        iVar8 = 0;
      }
      ppcVar10 = ColorEdit4::ids;
      uVar12 = 1;
      local_140 = 0;
      uVar16 = 0;
      for (; local_90 != uVar17; uVar17 = uVar17 + 4) {
        if (uVar17 != 0) {
          SameLine(0.0,(local_b0->Style).ItemInnerSpacing.x);
        }
        fVar22 = local_11c;
        if (uVar14 <= uVar12) {
          fVar22 = local_134;
        }
        SetNextItemWidth(fVar22);
        lVar7 = (ulong)(uint)(iVar8 << 5) + uVar17 * 2;
        if (((uint)local_148 >> 0x18 & 1) == 0) {
          bVar19 = DragInt(*ppcVar10,(int *)((long)&local_118 + uVar17),1.0,0,local_cc,
                           *(char **)((long)ColorEdit4::fmt_table_int[0] + lVar7),0);
          bVar13 = (byte)uVar16 | bVar19;
        }
        else {
          bVar19 = DragFloat(*ppcVar10,(float *)((long)local_158 + uVar17),0.003921569,0.0,local_120
                             ,*(char **)((long)ColorEdit4::fmt_table_float[0] + lVar7),0);
          bVar13 = (byte)uVar16 | bVar19;
          local_140 = CONCAT71((int7)(local_140 >> 8),(byte)local_140 | bVar13);
        }
        uVar16 = (ulong)bVar13;
        if ((local_130 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        ppcVar10 = ppcVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      label = local_100;
      col_00 = local_e8;
      pIVar18 = local_b0;
      uVar11 = local_dc;
      flags_00 = (uint)local_130;
    }
    if ((flags_00 & 0x10) == 0) {
      fVar22 = 0.0;
      if (((flags_00 & 0x20) == 0) && ((pIVar18->Style).ColorButtonPosition != 0)) {
        fVar22 = local_138 + (pIVar18->Style).ItemInnerSpacing.x;
      }
      (local_f0->DC).CursorPos.x = fVar22 + local_a8.x;
      (local_f0->DC).CursorPos.y = local_a8.y;
      buf._0_8_ = *(undefined8 *)col_00;
      buf._8_4_ = col_00[2];
      if ((flags_00 & 2) == 0) {
        buf._12_4_ = col_00[3];
      }
      else {
        buf._12_4_ = 1.0;
      }
      bVar19 = ColorButton("##ColorButton",(ImVec4 *)buf,flags_00,(ImVec2)0x0);
      if (((flags_00 & 4) == 0) && (bVar19)) {
        *(undefined8 *)&pIVar18->ColorPickerRef = buf._0_8_;
        (pIVar18->ColorPickerRef).z = (float)buf._8_4_;
        (pIVar18->ColorPickerRef).w = (float)buf._12_4_;
        OpenPopup("picker",0);
        local_80.y = (pIVar18->Style).ItemSpacing.y + (pIVar18->LastItemData).Rect.Max.y;
        local_80.x = (pIVar18->LastItemData).Rect.Min.x + 0.0;
        local_88.x = 0.0;
        local_88.y = 0.0;
        SetNextWindowPos(&local_80,0,&local_88);
      }
      if ((flags_00 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_148 = (ImGuiWindow *)0x0;
      bVar19 = BeginPopup("picker",0);
      if (bVar19) {
        local_148 = pIVar18->CurrentWindow;
        local_130 = uVar16;
        if (local_f8 != label) {
          TextEx(label,local_f8,0);
          Spacing();
        }
        uVar9 = local_d8 & 0x1f890002;
        SetNextItemWidth(local_128 * 12.0);
        bVar19 = ColorPicker4("##picker",col_00,uVar9 | 0x740080,&(pIVar18->ColorPickerRef).x);
        uVar16 = (ulong)(byte)((byte)local_130 | bVar19);
        EndPopup();
      }
    }
    else {
      local_148 = (ImGuiWindow *)0x0;
    }
    if ((local_f8 != label) && ((flags_00 & 0x80) == 0)) {
      if ((flags_00 & 0x20) == 0) {
        local_c8 = ZEXT416((uint)(local_124 + (pIVar18->Style).ItemInnerSpacing.x));
      }
      IVar21.x = local_a8.x + (float)local_c8._0_4_;
      IVar21.y = local_a8.y + (pIVar18->Style).FramePadding.y;
      (local_f0->DC).CursorPos = IVar21;
      TextEx(label,local_f8,0);
    }
    uVar9 = local_d4;
    if (((uVar16 & 1) != 0) && (local_148 == (ImGuiWindow *)0x0)) {
      if ((local_140 & 1) == 0) {
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          local_158[lVar7] = (float)(int)(&local_118)[lVar7] / 255.0;
        }
      }
      if ((uVar9 & 0x8200000) == 0) {
        pIVar18->ColorEditLastHue = local_158[0];
        pIVar18->ColorEditLastSat = local_158[1];
        ColorConvertHSVtoRGB
                  ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                   local_158 + 1,local_158 + 2);
        buf._0_8_ = local_158._0_8_;
        buf._8_4_ = local_158[2];
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        IVar3 = ColorConvertFloat4ToU32((ImVec4 *)buf);
        pIVar18->ColorEditLastColor = IVar3;
      }
      if (local_d0 == 0x10100000) {
        ColorConvertRGBtoHSV
                  ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                   local_158 + 1,local_158 + 2);
      }
      *(undefined8 *)col_00 = local_158._0_8_;
      col_00[2] = local_158[2];
      if ((flags_00 & 2) == 0) {
        col_00[3] = local_158[3];
      }
    }
    PopID();
    EndGroup();
    if ((((flags_00 >> 9 & 1) == 0) && (((pIVar18->LastItemData).StatusFlags & 1U) != 0)) &&
       (bVar19 = BeginDragDropTarget(), bVar19)) {
      pIVar5 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar5 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar5->Data;
        col_00[2] = *(float *)(puVar2 + 1);
        *(undefined8 *)col_00 = *puVar2;
        uVar16 = 1;
      }
      pIVar6 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar6 != (ImGuiPayload *)0x0) {
        memcpy(col_00,pIVar6->Data,(ulong)(uint)((int)local_98 << 2));
        uVar16 = 1;
      }
      if ((pIVar6 != (ImGuiPayload *)0x0 || pIVar5 != (ImGuiPayload *)0x0) &&
          (uVar11 >> 0x1c & 1) != 0) {
        ColorConvertRGBtoHSV(*col_00,col_00[1],col_00[2],col_00,col_00 + 1,col_00 + 2);
      }
      EndDragDropTarget();
    }
    bVar13 = (byte)uVar16;
    if (((local_148 != (ImGuiWindow *)0x0) && (pIVar18->ActiveId != 0)) &&
       (pIVar18->ActiveIdWindow == local_148)) {
      (pIVar18->LastItemData).ID = pIVar18->ActiveId;
    }
    if ((uVar16 & 1) != 0) {
      MarkItemEdited((pIVar18->LastItemData).ID);
    }
  }
  else {
    bVar13 = 0;
  }
  return (bool)(bVar13 & 1);
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}